

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hawktracer.cpp
# Opt level: O2

HT_TCPListener * ht_tcp_listener_create(int port,size_t buffer_size,HT_ErrorCode *out_err)

{
  HT_ErrorCode HVar1;
  HT_Boolean HVar2;
  HT_TCPListener *listener;
  HT_Mutex *pHVar3;
  HT_TCPServer *server;
  
  listener = (HT_TCPListener *)ht_alloc(0x40);
  if (listener == (HT_TCPListener *)0x0) {
    listener = (HT_TCPListener *)0x0;
    if (out_err == (HT_ErrorCode *)0x0) {
      return (HT_TCPListener *)0x0;
    }
    HVar1 = HT_ERR_OUT_OF_MEMORY;
    goto LAB_00109689;
  }
  HVar1 = ht_listener_buffer_init(&listener->_buffer,buffer_size);
  if (HVar1 == HT_ERR_OK) {
    listener->_last_client_sock_fd = 0;
    listener->_was_flushed = 0;
    pHVar3 = ht_mutex_create();
    listener->_push_action_mutex = pHVar3;
    server = ht_tcp_server_create();
    listener->_tcp_server = server;
    HVar2 = ht_tcp_server_start(server,port,ht_tcp_listener_client_connected,listener);
    HVar1 = HT_ERR_OK;
    if (HVar2 == 0) {
      HVar1 = HT_ERR_CANT_START_TCP_SERVER;
      goto LAB_00109639;
    }
  }
  else {
LAB_00109639:
    ht_tcp_listener_destroy(listener);
    listener = (HT_TCPListener *)0x0;
  }
  if (out_err == (HT_ErrorCode *)0x0) {
    return listener;
  }
LAB_00109689:
  *out_err = HVar1;
  return listener;
}

Assistant:

HT_TCPListener*
ht_tcp_listener_create(int port, size_t buffer_size, HT_ErrorCode* out_err)
{
    HT_TCPListener* listener = HT_CREATE_TYPE(HT_TCPListener);
    if (!listener)
    {
        HT_SET_ERROR(out_err, HT_ERR_OUT_OF_MEMORY);
        return NULL;
    }

    HT_ErrorCode error_code = ht_tcp_listener_init(listener, port, buffer_size);
    if (error_code != HT_ERR_OK)
    {
        ht_tcp_listener_destroy(listener);
        listener = NULL;
    }

    HT_SET_ERROR(out_err, error_code);
    return listener;
}